

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

void Saig_BmcAddTargetsAsPos(Saig_Bmc_t *p)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = p->vTargets;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      Aig_ObjCreateCo(p->pFrm,(Aig_Obj_t *)pVVar1->pArray[lVar2]);
      lVar2 = lVar2 + 1;
      pVVar1 = p->vTargets;
    } while (lVar2 < pVVar1->nSize);
  }
  Aig_ManPrintStats(p->pFrm);
  Aig_ManCleanup(p->pFrm);
  Aig_ManPrintStats(p->pFrm);
  return;
}

Assistant:

void Saig_BmcAddTargetsAsPos( Saig_Bmc_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTargets, pObj, i )
        Aig_ObjCreateCo( p->pFrm, pObj );
    Aig_ManPrintStats( p->pFrm );
    Aig_ManCleanup( p->pFrm );
    Aig_ManPrintStats( p->pFrm );
}